

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O0

void __thiscall minihttp::HttpSocket::~HttpSocket(HttpSocket *this)

{
  HttpSocket *this_local;
  
  (this->super_TcpSocket)._vptr_TcpSocket = (_func_int **)&PTR__HttpSocket_0011fc98;
  Request::~Request(&this->_curRequest);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->_hdrs);
  std::queue<minihttp::Request,_std::deque<minihttp::Request,_std::allocator<minihttp::Request>_>_>
  ::~queue(&this->_requestQ);
  std::__cxx11::string::~string((string *)&this->_tmpHdr);
  std::__cxx11::string::~string((string *)&this->_accept_encoding);
  std::__cxx11::string::~string((string *)&this->_user_agent);
  TcpSocket::~TcpSocket(&this->super_TcpSocket);
  return;
}

Assistant:

HttpSocket::~HttpSocket()
{
}